

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * google::protobuf::compiler::csharp::ShoutyToPascalCase
                   (string *__return_storage_ptr__,string *input)

{
  char c;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  char *pcVar4;
  undefined4 local_20;
  undefined1 local_1a;
  char current;
  int i;
  char previous;
  string *input_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_1a = '_';
  for (local_20 = 0; uVar3 = std::__cxx11::string::size(), (ulong)(long)local_20 < uVar3;
      local_20 = local_20 + 1) {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)input);
    c = *pcVar4;
    bVar1 = ascii_isalnum(c);
    if (bVar1) {
      bVar1 = ascii_isalnum(local_1a);
      if (bVar1) {
        bVar1 = ascii_isdigit(local_1a);
        if (bVar1) {
          cVar2 = ascii_toupper(c);
          std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
        }
        else {
          bVar1 = ascii_islower(local_1a);
          if (bVar1) {
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,c);
          }
          else {
            cVar2 = ascii_tolower(c);
            std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
          }
        }
      }
      else {
        cVar2 = ascii_toupper(c);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,cVar2);
      }
    }
    local_1a = c;
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ShoutyToPascalCase(const std::string& input) {
  string result;
  // Simple way of implementing "always start with upper"
  char previous = '_';
  for (int i = 0; i < input.size(); i++) {
    char current = input[i];
    if (!ascii_isalnum(current)) {
      previous = current;
      continue;      
    }
    if (!ascii_isalnum(previous)) {
      result += ascii_toupper(current);
    } else if (ascii_isdigit(previous)) {
      result += ascii_toupper(current);
    } else if (ascii_islower(previous)) {
      result += current;
    } else {
      result += ascii_tolower(current);
    }
    previous = current;
  }
  return result;
}